

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

AstNode * parse_yindex(ParserState *parser)

{
  LexerState *ls_00;
  AstNode *pAVar1;
  AstNode *pAVar2;
  AstNode *index;
  AstNode *expr;
  LexerState *ls;
  ParserState *parser_local;
  
  ls_00 = parser->ls;
  raviX_next(ls_00);
  pAVar1 = parse_expression(parser);
  checknext(ls_00,0x5d);
  pAVar2 = allocate_expr_ast_node(parser,EXPR_Y_INDEX);
  (pAVar2->field_2).function_stmt.function_expr = pAVar1;
  set_type((VariableType *)&(pAVar2->field_2).return_stmt,RAVI_TANY);
  return pAVar2;
}

Assistant:

static AstNode *parse_yindex(ParserState *parser)
{
	LexerState *ls = parser->ls;
	/* index -> '[' expr ']' */
	raviX_next(ls); /* skip the '[' */
	AstNode *expr = parse_expression(parser);
	checknext(ls, ']');

	AstNode *index = allocate_expr_ast_node(parser, EXPR_Y_INDEX);
	index->index_expr.expr = expr;
	set_type(&index->index_expr.type, RAVI_TANY);
	return index;
}